

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

ConstNodeRef __thiscall c4::yml::Tree::operator[](Tree *this,size_t i)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  bool bVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  ConstNodeRef CVar12;
  csubstr cVar13;
  char msg [68];
  size_t local_50;
  char msg_1 [27];
  
  bVar11 = 0;
  CVar12 = rootref(this);
  if (CVar12.m_tree == (Tree *)0x0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        CVar12 = (ConstNodeRef)(*pcVar2)();
        return CVar12;
      }
    }
    msg._24_16_ = (undefined1  [16])
                  to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = -0x46;
    msg[9] = 'P';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    (*(code *)PTR_error_impl_0028c7d8)
              ("check failed: ((ConstImpl const* __restrict__)this)->m_tree != nullptr",0x46,
               (anonymous_namespace)::s_default_callbacks);
  }
  if (CVar12.m_id == 0xffffffffffffffff) {
    pcVar9 = "check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)";
    pcVar10 = msg;
    for (lVar8 = 0x44; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pcVar10 = *pcVar9;
      pcVar9 = pcVar9 + (ulong)bVar11 * -2 + 1;
      pcVar10 = pcVar10 + (ulong)bVar11 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        CVar12 = (ConstNodeRef)(*pcVar2)();
        return CVar12;
      }
    }
    p_Var1 = ((CVar12.m_tree)->m_callbacks).m_error;
    cVar13 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_50 = cVar13.len;
    auVar4 = ZEXT1224(ZEXT412(0x50ba) << 0x40);
    LVar3.name.str._0_4_ = (int)cVar13.str;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = cVar13.str._4_4_;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x44,LVar3,((CVar12.m_tree)->m_callbacks).m_user_data);
  }
  sVar7 = child(CVar12.m_tree,CVar12.m_id,i);
  if (sVar7 == 0xffffffffffffffff) {
    builtin_strncpy(msg_1 + 0x10,"h != NONE)",0xb);
    builtin_strncpy(msg_1,"check failed: (c",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        CVar12 = (ConstNodeRef)(*pcVar2)();
        return CVar12;
      }
    }
    p_Var1 = ((CVar12.m_tree)->m_callbacks).m_error;
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = -0x44;
    msg[9] = 'P';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    cVar13 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    msg._32_8_ = cVar13.len;
    LVar5.super_LineCol.line._0_4_ = (int)msg._8_8_;
    LVar5.super_LineCol.offset._0_1_ = msg[0];
    LVar5.super_LineCol.offset._1_1_ = msg[1];
    LVar5.super_LineCol.offset._2_1_ = msg[2];
    LVar5.super_LineCol.offset._3_1_ = msg[3];
    LVar5.super_LineCol.offset._4_1_ = msg[4];
    LVar5.super_LineCol.offset._5_1_ = msg[5];
    LVar5.super_LineCol.offset._6_1_ = msg[6];
    LVar5.super_LineCol.offset._7_1_ = msg[7];
    LVar5.super_LineCol.line._4_4_ = SUB84(msg._8_8_,4);
    LVar5.super_LineCol.col._0_4_ = (int)msg._16_8_;
    LVar5.super_LineCol.col._4_4_ = SUB84(msg._16_8_,4);
    LVar5.name.str._0_4_ = (int)cVar13.str;
    LVar5.name.str._4_4_ = cVar13.str._4_4_;
    LVar5.name.len._0_1_ = msg[0x20];
    LVar5.name.len._1_1_ = msg[0x21];
    LVar5.name.len._2_1_ = msg[0x22];
    LVar5.name.len._3_1_ = msg[0x23];
    LVar5.name.len._4_1_ = msg[0x24];
    LVar5.name.len._5_1_ = msg[0x25];
    LVar5.name.len._6_1_ = msg[0x26];
    LVar5.name.len._7_1_ = msg[0x27];
    msg._24_16_ = (undefined1  [16])cVar13;
    (*p_Var1)(msg_1,0x1b,LVar5,((CVar12.m_tree)->m_callbacks).m_user_data);
  }
  CVar12.m_id = sVar7;
  return CVar12;
}

Assistant:

ConstNodeRef Tree::operator[] (size_t i) const
{
    return rootref()[i];
}